

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O3

void __thiscall
pbrt::NanoVDBMediumProvider::NanoVDBMediumProvider
          (NanoVDBMediumProvider *this,Bounds3f *bounds,GridHandle<pbrt::NanoVDBBuffer> *dg,
          GridHandle<pbrt::NanoVDBBuffer> *tg,Float LeScale,Float temperatureCutoff,
          Float temperatureScale)

{
  FloatGrid *pFVar1;
  undefined8 uVar2;
  float fVar3;
  int iVar4;
  memory_resource *pmVar5;
  undefined4 extraout_var;
  FloatGrid *pFVar6;
  Float maxTemperature;
  float local_4c;
  string local_48;
  
  fVar3 = (bounds->pMax).super_Tuple3<pbrt::Point3,_float>.z;
  (this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y =
       (bounds->pMax).super_Tuple3<pbrt::Point3,_float>.y;
  (this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar3;
  fVar3 = (bounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
  uVar2 = *(undefined8 *)&(bounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
  (this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x =
       (bounds->pMin).super_Tuple3<pbrt::Point3,_float>.x;
  (this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar3;
  *(undefined8 *)&(this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar2;
  (this->densityGrid).super_GridHandleBase._vptr_GridHandleBase =
       (_func_int **)&PTR__GridHandle_02d37e58;
  pmVar5 = pstd::pmr::new_delete_resource();
  (this->densityGrid).mBuffer.alloc.memoryResource = pmVar5;
  (this->densityGrid).mBuffer.bytesAllocated = 0;
  (this->densityGrid).mBuffer.ptr = (uint8_t *)0x0;
  NanoVDBBuffer::operator=(&(this->densityGrid).mBuffer,&dg->mBuffer);
  (this->temperatureGrid).super_GridHandleBase._vptr_GridHandleBase =
       (_func_int **)&PTR__GridHandle_02d37e58;
  pmVar5 = pstd::pmr::new_delete_resource();
  (this->temperatureGrid).mBuffer.alloc.memoryResource = pmVar5;
  (this->temperatureGrid).mBuffer.bytesAllocated = 0;
  (this->temperatureGrid).mBuffer.ptr = (uint8_t *)0x0;
  NanoVDBBuffer::operator=(&(this->temperatureGrid).mBuffer,&tg->mBuffer);
  this->densityFloatGrid = (FloatGrid *)0x0;
  this->temperatureFloatGrid = (FloatGrid *)0x0;
  this->LeScale = LeScale;
  this->temperatureCutoff = temperatureCutoff;
  this->temperatureScale = temperatureScale;
  pFVar1 = (FloatGrid *)(this->densityGrid).mBuffer.ptr;
  pFVar6 = (FloatGrid *)0x0;
  if ((pFVar1 != (FloatGrid *)0x0) && ((pFVar1->super_GridData).mGridType == Float)) {
    pFVar6 = pFVar1;
  }
  this->densityFloatGrid = pFVar6;
  iVar4 = (*(this->temperatureGrid).super_GridHandleBase._vptr_GridHandleBase[2])
                    (&this->temperatureGrid);
  if (CONCAT44(extraout_var,iVar4) != 0) {
    pFVar1 = (FloatGrid *)(this->temperatureGrid).mBuffer.ptr;
    pFVar6 = (FloatGrid *)0x0;
    if ((pFVar1->super_GridData).mGridType == Float) {
      pFVar6 = pFVar1;
    }
    this->temperatureFloatGrid = pFVar6;
    local_4c = *(float *)(pFVar6[1].super_GridData.mGridName +
                         pFVar6[1].super_GridData.mGridSize + 0xc);
    if (LOGGING_LogLevel < 1) {
      local_48._M_string_length = 0;
      local_48.field_2._M_local_buf[0] = '\0';
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      detail::stringPrintfRecursive<float&>(&local_48,"Max temperature: %f",&local_4c);
      Log(Verbose,
          "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/media.h"
          ,0x247,local_48._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,
                        CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                                 local_48.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  return;
}

Assistant:

NanoVDBMediumProvider(const Bounds3f &bounds, nanovdb::GridHandle<NanoVDBBuffer> dg,
                          nanovdb::GridHandle<NanoVDBBuffer> tg, Float LeScale,
                          Float temperatureCutoff, Float temperatureScale)
        : bounds(bounds),
          densityGrid(std::move(dg)),
          temperatureGrid(std::move(tg)),
          LeScale(LeScale),
          temperatureCutoff(temperatureCutoff),
          temperatureScale(temperatureScale) {
        densityFloatGrid = densityGrid.grid<float>();
        if (temperatureGrid) {
            temperatureFloatGrid = temperatureGrid.grid<float>();
            Float minTemperature, maxTemperature;
            temperatureFloatGrid->tree().extrema(minTemperature, maxTemperature);
            LOG_VERBOSE("Max temperature: %f", maxTemperature);
        }
    }